

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsXYZROTnode.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChLoadXYZROTnodeBodyBushingGeneric::ChLoadXYZROTnodeBodyBushingGeneric
          (ChLoadXYZROTnodeBodyBushingGeneric *this,shared_ptr<chrono::fea::ChNodeFEAxyzrot> *mnodeA
          ,shared_ptr<chrono::ChBody> *mbodyB,ChFrame<double> *abs_application,
          ChMatrixConstRef mstiffness,ChMatrixConstRef mdamping)

{
  double *pdVar1;
  long lVar2;
  double dVar3;
  PointerType ptr;
  undefined1 auVar4 [32];
  shared_ptr<chrono::ChBody> local_58;
  shared_ptr<chrono::fea::ChNodeFEAxyzrot> local_48;
  undefined1 local_38 [24];
  double local_20;
  
  local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
  ;
  local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (mnodeA->super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>).
          _M_refcount._M_pi;
  if (local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
       _M_refcount._M_pi)->_M_use_count =
           (local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (mbodyB->super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  if (local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)->
      _M_use_count = (local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
                      _M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  ChLoadXYZROTnodeBody::ChLoadXYZROTnodeBody
            (&this->super_ChLoadXYZROTnodeBody,&local_48,&local_58,abs_application);
  if (local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_58.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.super___shared_ptr<chrono::fea::ChNodeFEAxyzrot,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  (this->super_ChLoadXYZROTnodeBody).super_ChLoadCustomMultiple.super_ChLoadBase.super_ChObj.
  _vptr_ChObj = (_func_int **)&PTR__ChLoadXYZROTnodeBodyBushingGeneric_00b53530;
  if (((mstiffness->
       super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
       ).
       super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
       .m_rows.m_value == 6) &&
     ((mstiffness->
      super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
      ).
      super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
      .m_cols.m_value == 6)) {
    pdVar1 = (mstiffness->
             super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
             ).
             super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
             .m_data;
    lVar2 = (mstiffness->
            super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
            ).m_stride.m_outer.m_value;
    dVar3 = pdVar1[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0] = *pdVar1;
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[1] = dVar3;
    dVar3 = pdVar1[3];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[2] = pdVar1[2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[3] = dVar3;
    dVar3 = pdVar1[5];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[4] = pdVar1[4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[5] = dVar3;
    dVar3 = (pdVar1 + lVar2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[6] = pdVar1[lVar2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[7] = dVar3;
    dVar3 = (pdVar1 + lVar2 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[8] = pdVar1[lVar2 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[9] = dVar3;
    dVar3 = (pdVar1 + lVar2 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[10] = pdVar1[lVar2 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xb] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xc] = pdVar1[lVar2 * 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xd] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 2 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xe] = pdVar1[lVar2 * 2 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0xf] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 2 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x10] = pdVar1[lVar2 * 2 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x11] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 3)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x12] = pdVar1[lVar2 * 3];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x13] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 3 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x14] = pdVar1[lVar2 * 3 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x15] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 3 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x16] = pdVar1[lVar2 * 3 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x17] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x18] = pdVar1[lVar2 * 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x19] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 4 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1a] = pdVar1[lVar2 * 4 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1b] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 4 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1c] = pdVar1[lVar2 * 4 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1d] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 5)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1e] = pdVar1[lVar2 * 5];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x1f] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 5 + 2)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x20] = pdVar1[lVar2 * 5 + 2];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x21] = dVar3;
    dVar3 = (pdVar1 + lVar2 * 5 + 4)[1];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x22] = pdVar1[lVar2 * 5 + 4];
    (this->stiffness).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
    array[0x23] = dVar3;
    if (((mdamping->
         super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
         ).
         super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
         .m_rows.m_value == 6) &&
       ((mdamping->
        super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
        ).
        super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
        .m_cols.m_value == 6)) {
      pdVar1 = (mdamping->
               super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
               ).
               super_MapBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>,_0>
               .m_data;
      lVar2 = (mdamping->
              super_RefBase<Eigen::Ref<const_Eigen::Matrix<double,__1,__1,_1,__1,__1>,_0,_Eigen::OuterStride<_1>_>_>
              ).m_stride.m_outer.m_value;
      dVar3 = pdVar1[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0] = *pdVar1;
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[1] = dVar3;
      dVar3 = pdVar1[3];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[2] = pdVar1[2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[3] = dVar3;
      dVar3 = pdVar1[5];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[4] = pdVar1[4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[5] = dVar3;
      dVar3 = (pdVar1 + lVar2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[6] = pdVar1[lVar2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[7] = dVar3;
      dVar3 = (pdVar1 + lVar2 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[8] = pdVar1[lVar2 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[9] = dVar3;
      dVar3 = (pdVar1 + lVar2 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[10] = pdVar1[lVar2 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xb] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xc] = pdVar1[lVar2 * 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xd] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 2 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xe] = pdVar1[lVar2 * 2 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0xf] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 2 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x10] = pdVar1[lVar2 * 2 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x11] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 3)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x12] = pdVar1[lVar2 * 3];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x13] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 3 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x14] = pdVar1[lVar2 * 3 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x15] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 3 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x16] = pdVar1[lVar2 * 3 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x17] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x18] = pdVar1[lVar2 * 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x19] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 4 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1a] = pdVar1[lVar2 * 4 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1b] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 4 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1c] = pdVar1[lVar2 * 4 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1d] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 5)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1e] = pdVar1[lVar2 * 5];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x1f] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 5 + 2)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x20] = pdVar1[lVar2 * 5 + 2];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x21] = dVar3;
      dVar3 = (pdVar1 + lVar2 * 5 + 4)[1];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x22] = pdVar1[lVar2 * 5 + 4];
      (this->damping).super_PlainObjectBase<Eigen::Matrix<double,_6,_6,_1,_6,_6>_>.m_storage.m_data.
      array[0x23] = dVar3;
      auVar4 = ZEXT832(0) << 0x20;
      this->neutral_force = (ChVector<double>)auVar4._0_24_;
      (this->neutral_torque).m_data[0] = (double)auVar4._24_8_;
      *(undefined1 (*) [32])((this->neutral_force).m_data + 2) = auVar4;
      local_38._0_8_ = 1.0;
      local_38._8_16_ = ZEXT816(0) << 0x20;
      local_20 = 0.0;
      (this->neutral_displacement)._vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b2b308;
      *(undefined1 (*) [16])(this->neutral_displacement).coord.pos.m_data = local_38._8_16_;
      (this->neutral_displacement).coord.pos.m_data[2] = 0.0;
      (this->neutral_displacement).coord.rot.m_data[0] = 1.0;
      *(undefined1 (*) [16])((this->neutral_displacement).coord.rot.m_data + 1) = local_38._8_16_;
      (this->neutral_displacement).coord.rot.m_data[3] = 0.0;
      ChMatrix33<double>::ChMatrix33
                (&(this->neutral_displacement).Amatrix,(ChQuaternion<double> *)local_38);
      return;
    }
  }
  __assert_fail("(!(RowsAtCompileTime!=Dynamic) || (rows==RowsAtCompileTime)) && (!(ColsAtCompileTime!=Dynamic) || (cols==ColsAtCompileTime)) && (!(RowsAtCompileTime==Dynamic && MaxRowsAtCompileTime!=Dynamic) || (rows<=MaxRowsAtCompileTime)) && (!(ColsAtCompileTime==Dynamic && MaxColsAtCompileTime!=Dynamic) || (cols<=MaxColsAtCompileTime)) && rows>=0 && cols>=0 && \"Invalid sizes when resizing a matrix or array.\""
                ,"/usr/include/eigen3/Eigen/src/Core/PlainObjectBase.h",0x115,
                "void Eigen::PlainObjectBase<Eigen::Matrix<double, 6, 6, 1>>::resize(Index, Index) [Derived = Eigen::Matrix<double, 6, 6, 1>]"
               );
}

Assistant:

ChLoadXYZROTnodeBodyBushingGeneric::ChLoadXYZROTnodeBodyBushingGeneric(std::shared_ptr<ChNodeFEAxyzrot> mnodeA,
                                                                       std::shared_ptr<ChBody> mbodyB,
                                                                       const ChFrame<>& abs_application,
                                                                       ChMatrixConstRef mstiffness,
                                                                       ChMatrixConstRef mdamping)
    : ChLoadXYZROTnodeBody(mnodeA, mbodyB, abs_application), stiffness(mstiffness), damping(mdamping) {}